

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<double[3]>::ChValueSpecific
          (ChValueSpecific<double[3]> *this,double (*mvalp) [3],char *mname,char flags)

{
  char flags_local;
  char *mname_local;
  double (*mvalp_local) [3];
  ChValueSpecific<double[3]> *this_local;
  
  ChValue::ChValue(&this->super_ChValue);
  (this->super_ChValue)._vptr_ChValue = (_func_int **)&PTR__ChValueSpecific_001d7780;
  this->_ptr_to_val = mvalp;
  std::__cxx11::string::operator=((string *)&(this->super_ChValue)._name,mname);
  (this->super_ChValue)._flags = flags;
  return;
}

Assistant:

ChValueSpecific(TClass& mvalp, const char* mname, char flags) { 
          _ptr_to_val = (TClass*)(& mvalp);
          _name = mname;
          _flags = flags;
      }